

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# city.cc
# Opt level: O1

uint64 HashLen0to16(char *s,size_t len)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  
  if (len < 8) {
    if (len < 4) {
      if (len == 0) {
        return 0x9ae16a3b2f90404f;
      }
      uVar4 = ((ulong)(byte)s[len - 1] << 2 | len) * -0x3c5a37a36834ced9 ^
              (ulong)CONCAT11(s[len >> 1],*s) * -0x651e95c4d06fbfb1;
      return (uVar4 >> 0x2f ^ uVar4) * -0x651e95c4d06fbfb1;
    }
    lVar3 = len * 2 + -0x651e95c4d06fbfb1;
    uVar4 = (len + (ulong)*(uint *)s * 8 ^ (ulong)*(uint *)(s + (len - 4))) * lVar3;
    uVar4 = (uVar4 >> 0x2f ^ *(uint *)(s + (len - 4)) ^ uVar4) * lVar3;
    uVar4 = uVar4 >> 0x2f ^ uVar4;
  }
  else {
    lVar3 = len * 2 + -0x651e95c4d06fbfb1;
    uVar1 = *(long *)s + 0x9ae16a3b2f90404f;
    uVar4 = *(ulong *)(s + (len - 8));
    uVar2 = ((uVar1 << 0x27 | uVar1 >> 0x19) + uVar4) * lVar3;
    uVar4 = ((uVar4 << 0x1b | uVar4 >> 0x25) * lVar3 + uVar1 ^ uVar2) * lVar3;
    uVar4 = (uVar4 >> 0x2f ^ uVar2 ^ uVar4) * lVar3;
    uVar4 = uVar4 >> 0x2f ^ uVar4;
  }
  return uVar4 * lVar3;
}

Assistant:

static uint64 HashLen0to16(const char *s, size_t len) {
  if (len >= 8) {
    uint64 mul = k2 + len * 2;
    uint64 a = Fetch64(s) + k2;
    uint64 b = Fetch64(s + len - 8);
    uint64 c = Rotate(b, 37) * mul + a;
    uint64 d = (Rotate(a, 25) + b) * mul;
    return HashLen16(c, d, mul);
  }
  if (len >= 4) {
    uint64 mul = k2 + len * 2;
    uint64 a = Fetch32(s);
    return HashLen16(len + (a << 3), Fetch32(s + len - 4), mul);
  }
  if (len > 0) {
    uint8 a = s[0];
    uint8 b = s[len >> 1];
    uint8 c = s[len - 1];
    uint32 y = static_cast<uint32>(a) + (static_cast<uint32>(b) << 8);
    uint32 z = len + (static_cast<uint32>(c) << 2);
    return ShiftMix(y * k2 ^ z * k0) * k2;
  }
  return k2;
}